

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::LocationRecorder
          (LocationRecorder *this,Parser *parser)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  SourceCodeInfo *pSVar4;
  void **ppvVar5;
  Location *pLVar6;
  SourceCodeInfo_Location *pSVar7;
  
  this->parser_ = parser;
  pSVar4 = parser->source_code_info_;
  iVar2 = (pSVar4->location_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = (pSVar4->location_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar2 < iVar3) {
    ppvVar5 = (pSVar4->location_).super_RepeatedPtrFieldBase.elements_;
    (pSVar4->location_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pSVar7 = (SourceCodeInfo_Location *)ppvVar5[iVar2];
  }
  else {
    iVar2 = (pSVar4->location_).super_RepeatedPtrFieldBase.total_size_;
    if (iVar3 == iVar2) {
      internal::RepeatedPtrFieldBase::Reserve
                (&(pSVar4->location_).super_RepeatedPtrFieldBase,iVar2 + 1);
    }
    piVar1 = &(pSVar4->location_).super_RepeatedPtrFieldBase.allocated_size_;
    *piVar1 = *piVar1 + 1;
    pSVar7 = internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>::New();
    ppvVar5 = (pSVar4->location_).super_RepeatedPtrFieldBase.elements_;
    iVar2 = (pSVar4->location_).super_RepeatedPtrFieldBase.current_size_;
    (pSVar4->location_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    ppvVar5[iVar2] = pSVar7;
  }
  this->location_ = pSVar7;
  iVar2 = (this->parser_->input_->current_).line;
  iVar3 = (pSVar7->span_).total_size_;
  if ((pSVar7->span_).current_size_ == iVar3) {
    RepeatedField<int>::Reserve(&pSVar7->span_,iVar3 + 1);
  }
  iVar3 = (pSVar7->span_).current_size_;
  (pSVar7->span_).current_size_ = iVar3 + 1;
  (pSVar7->span_).elements_[iVar3] = iVar2;
  pLVar6 = this->location_;
  iVar2 = (this->parser_->input_->current_).column;
  iVar3 = (pLVar6->span_).total_size_;
  if ((pLVar6->span_).current_size_ == iVar3) {
    RepeatedField<int>::Reserve(&pLVar6->span_,iVar3 + 1);
  }
  iVar3 = (pLVar6->span_).current_size_;
  (pLVar6->span_).current_size_ = iVar3 + 1;
  (pLVar6->span_).elements_[iVar3] = iVar2;
  return;
}

Assistant:

Parser::LocationRecorder::LocationRecorder(Parser* parser)
  : parser_(parser),
    location_(parser_->source_code_info_->add_location()) {
  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}